

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_dr_flac *
ma_dr_flac_open_with_metadata_private
          (ma_dr_flac_read_proc onRead,ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,
          ma_dr_flac_container container,void *pUserData,void *pUserDataMD,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_result mVar2;
  ma_dr_flac *pmVar3;
  void *__dest;
  size_t sVar4;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  ma_dr_flac_init_info *in_R9;
  undefined8 *in_stack_00000008;
  ma_result result;
  ma_uint32 iSeekpoint;
  ma_dr_flac_oggbs *pInternalOggbs;
  void *pUserDataOverride;
  ma_dr_flac_seek_proc onSeekOverride;
  ma_dr_flac_read_proc onReadOverride;
  ma_dr_flac *pFlac;
  ma_allocation_callbacks allocationCallbacks;
  ma_uint32 seekpointCount;
  ma_uint64 seektablePos;
  ma_uint64 firstFramePos;
  ma_dr_flac_oggbs *pOggbs;
  ma_uint32 decodedSamplesAllocationSize;
  ma_uint32 wholeSIMDVectorCountPerChannel;
  ma_uint32 allocationSize;
  ma_dr_flac_init_info init;
  ma_dr_flac_init_info *pInit;
  ma_dr_flac *in_stack_ffffffffffffed00;
  ma_dr_flac *in_stack_ffffffffffffed10;
  ma_dr_flac_container in_stack_ffffffffffffed1c;
  uint uVar5;
  ma_dr_flac_meta_proc in_stack_ffffffffffffed20;
  ma_dr_flac_seek_proc in_stack_ffffffffffffed28;
  ma_dr_flac_read_proc in_stack_ffffffffffffed30;
  ma_dr_flac_init_info *in_stack_ffffffffffffed38;
  void *local_12b8;
  _func_void_ptr_size_t_void_ptr *local_12b0;
  _func_void_ptr_void_ptr_size_t_void_ptr *local_12a8;
  void *in_stack_ffffffffffffed60;
  code *pcVar6;
  uint local_1294;
  ma_dr_flac_read_proc local_1290;
  ma_dr_flac_seek_proc local_1288;
  ma_dr_flac_meta_proc local_1280;
  uint local_1274;
  uint local_1270;
  int local_126c;
  ma_uint32 local_1250;
  byte local_1234;
  ushort local_1228;
  int local_1218;
  int local_1214;
  ma_dr_flac_frame_header *in_stack_ffffffffffffee20;
  ma_uint8 in_stack_ffffffffffffee2f;
  ma_dr_flac_bs *in_stack_ffffffffffffee30;
  ma_uint64 *in_stack_ffffffffffffee88;
  void *in_stack_ffffffffffffee90;
  void *in_stack_ffffffffffffee98;
  ma_dr_flac_meta_proc in_stack_ffffffffffffeea0;
  ma_dr_flac_seek_proc in_stack_ffffffffffffeea8;
  ma_dr_flac_read_proc in_stack_ffffffffffffeeb0;
  ma_uint64 *in_stack_fffffffffffff050;
  ma_uint32 *in_stack_fffffffffffff058;
  ma_allocation_callbacks *in_stack_fffffffffffff060;
  ma_uint64 local_1c0;
  ma_uint64 local_1b8;
  undefined8 local_1b0;
  ma_uint32 local_1a8;
  ma_uint8 local_1a0 [8];
  ma_uint64 amStack_198 [36];
  ma_dr_flac_init_info *local_78;
  undefined8 local_70;
  undefined8 local_58;
  undefined8 local_50;
  ma_dr_flac *local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ushort local_1c;
  ushort local_1a;
  ulong local_18;
  ulong local_10;
  ushort local_2;
  
  local_1280 = (ma_dr_flac_meta_proc)0x0;
  local_78 = in_R9;
  local_70 = in_R8;
  local_58 = in_RSI;
  local_50 = in_RDI;
  ma_dr_flac__init_cpu_caps();
  mVar1 = ma_dr_flac__init_private
                    (in_stack_ffffffffffffed38,in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,
                     in_stack_ffffffffffffed20,in_stack_ffffffffffffed1c,in_stack_ffffffffffffed10,
                     in_stack_ffffffffffffed60);
  if (mVar1 == 0) {
    local_48 = (ma_dr_flac *)0x0;
  }
  else {
    if (in_stack_00000008 == (undefined8 *)0x0) {
      local_12b8 = (void *)0x0;
      local_12b0 = ma_dr_flac__malloc_default;
      local_12a8 = ma_dr_flac__realloc_default;
      pcVar6 = ma_dr_flac__free_default;
    }
    else {
      local_12b8 = (void *)*in_stack_00000008;
      local_12b0 = (_func_void_ptr_size_t_void_ptr *)in_stack_00000008[1];
      local_12a8 = (_func_void_ptr_void_ptr_size_t_void_ptr *)in_stack_00000008[2];
      pcVar6 = (code *)in_stack_00000008[3];
      if ((pcVar6 == (_func_void_void_ptr_void_ptr *)0x0) ||
         ((local_12b0 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
          (local_12a8 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)))) {
        return (ma_dr_flac *)0x0;
      }
    }
    if ((local_1228 & 0xf) == 0) {
      local_1270 = (uint)(local_1228 >> 4);
    }
    else {
      local_1270 = (local_1228 >> 4) + 1;
    }
    local_1274 = local_1270 * 0x40 * (uint)local_1234;
    local_126c = local_1274 + 0x11c8;
    pInit = local_78;
    if (local_1250 == 1) {
      local_126c = local_1274 + 0x11360;
      local_1280 = (ma_dr_flac_meta_proc)
                   ma_dr_flac__malloc_from_callbacks
                             ((size_t)local_78,(ma_allocation_callbacks *)0x1fe5d0);
      if (local_1280 == (ma_dr_flac_meta_proc)0x0) {
        return (ma_dr_flac *)0x0;
      }
      memset(local_1280,0,0x10198);
      *(undefined8 *)local_1280 = local_50;
      *(undefined8 *)(local_1280 + 8) = local_58;
      *(undefined8 *)(local_1280 + 0x10) = local_70;
      *(ma_uint8 (*) [8])(local_1280 + 0x18) = local_1a0;
      *(ma_uint8 (*) [8])(local_1280 + 0x20) = local_1a0;
      *(ma_uint32 *)(local_1280 + 0x28) = local_1a8;
      memcpy(local_1280 + 0x30,amStack_198,0x120);
      *(undefined4 *)(local_1280 + 0x270) = 0;
      pInit = local_78;
    }
    local_1288 = (ma_dr_flac_seek_proc)0x2a;
    local_1290 = (ma_dr_flac_read_proc)0x0;
    local_1294 = 0;
    if (local_1214 != 0) {
      pInit = (ma_dr_flac_init_info *)&local_1290;
      in_stack_ffffffffffffed00 = (ma_dr_flac *)&local_1294;
      mVar1 = ma_dr_flac__read_and_decode_metadata
                        (in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
                         in_stack_ffffffffffffeea0,in_stack_ffffffffffffee98,
                         in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,
                         in_stack_fffffffffffff050,in_stack_fffffffffffff058,
                         in_stack_fffffffffffff060);
      if (mVar1 == 0) {
        ma_dr_flac__free_from_callbacks(in_stack_ffffffffffffed00,(ma_allocation_callbacks *)pInit);
        return (ma_dr_flac *)0x0;
      }
      local_126c = local_126c + local_1294 * 0x18;
    }
    pmVar3 = (ma_dr_flac *)
             ma_dr_flac__malloc_from_callbacks((size_t)pInit,(ma_allocation_callbacks *)0x1fe7d2);
    if (pmVar3 == (ma_dr_flac *)0x0) {
      ma_dr_flac__free_from_callbacks(in_stack_ffffffffffffed00,(ma_allocation_callbacks *)pInit);
      local_48 = (ma_dr_flac *)0x0;
    }
    else {
      ma_dr_flac__init_from_info(in_stack_ffffffffffffed00,pInit);
      (pmVar3->allocationCallbacks).pUserData = local_12b8;
      (pmVar3->allocationCallbacks).onMalloc = local_12b0;
      (pmVar3->allocationCallbacks).onRealloc = local_12a8;
      (pmVar3->allocationCallbacks).onFree = pcVar6;
      pmVar3->pDecodedSamples =
           (ma_int32 *)((ulong)((long)&pmVar3[1].maxBlockSizeInPCMFrames + 1) & 0xffffffffffffffc0);
      if (local_1250 == 1) {
        __dest = (void *)((long)pmVar3->pDecodedSamples +
                         (ulong)local_1294 * 0x18 + (ulong)local_1274);
        memcpy(__dest,local_1280,0x10198);
        ma_dr_flac__free_from_callbacks(in_stack_ffffffffffffed00,(ma_allocation_callbacks *)pInit);
        local_1280 = (ma_dr_flac_meta_proc)0x0;
        (pmVar3->bs).onRead = ma_dr_flac__on_read_ogg;
        (pmVar3->bs).onSeek = ma_dr_flac__on_seek_ogg;
        (pmVar3->bs).pUserData = __dest;
        pmVar3->_oggbs = __dest;
      }
      pmVar3->firstFLACFramePosInBytes = (ma_uint64)local_1288;
      if (local_1250 == 1) {
        pmVar3->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
        pmVar3->seekpointCount = 0;
      }
      else if (local_1290 != (ma_dr_flac_read_proc)0x0) {
        pmVar3->seekpointCount = local_1294;
        pmVar3->pSeekpoints =
             (ma_dr_flac_seekpoint *)((long)pmVar3->pDecodedSamples + (ulong)local_1274);
        mVar1 = (*(pmVar3->bs).onSeek)
                          ((pmVar3->bs).pUserData,(int)local_1290,ma_dr_flac_seek_origin_start);
        if (mVar1 == 0) {
          pmVar3->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
          pmVar3->seekpointCount = 0;
        }
        else {
          for (uVar5 = 0; uVar5 < local_1294; uVar5 = uVar5 + 1) {
            sVar4 = (*(pmVar3->bs).onRead)((pmVar3->bs).pUserData,pmVar3->pSeekpoints + uVar5,0x12);
            if (sVar4 != 0x12) {
              pmVar3->pSeekpoints = (ma_dr_flac_seekpoint *)0x0;
              pmVar3->seekpointCount = 0;
              break;
            }
            local_30 = pmVar3->pSeekpoints[uVar5].firstPCMFrame;
            local_28 = local_30 >> 0x38 | (local_30 & 0xff000000000000) >> 0x28 |
                       (local_30 & 0xff0000000000) >> 0x18 | (local_30 & 0xff00000000) >> 8 |
                       (local_30 & 0xff000000) << 8 | (local_30 & 0xff0000) << 0x18 |
                       (local_30 & 0xff00) << 0x28 | local_30 << 0x38;
            pmVar3->pSeekpoints[uVar5].firstPCMFrame = local_28;
            local_40 = pmVar3->pSeekpoints[uVar5].flacFrameOffset;
            local_38 = local_40 >> 0x38 | (local_40 & 0xff000000000000) >> 0x28 |
                       (local_40 & 0xff0000000000) >> 0x18 | (local_40 & 0xff00000000) >> 8 |
                       (local_40 & 0xff000000) << 8 | (local_40 & 0xff0000) << 0x18 |
                       (local_40 & 0xff00) << 0x28 | local_40 << 0x38;
            pmVar3->pSeekpoints[uVar5].flacFrameOffset = local_38;
            local_1c = pmVar3->pSeekpoints[uVar5].pcmFrameCount;
            local_1a = local_1c << 8 | local_1c >> 8;
            pmVar3->pSeekpoints[uVar5].pcmFrameCount = local_1a;
            local_18 = local_30;
            local_10 = local_40;
            local_2 = local_1c;
          }
          mVar1 = (*(pmVar3->bs).onSeek)
                            ((pmVar3->bs).pUserData,(int)pmVar3->firstFLACFramePosInBytes,
                             ma_dr_flac_seek_origin_start);
          if (mVar1 == 0) {
            ma_dr_flac__free_from_callbacks
                      (in_stack_ffffffffffffed00,(ma_allocation_callbacks *)pInit);
            return (ma_dr_flac *)0x0;
          }
        }
      }
      local_48 = pmVar3;
      if (local_1218 == 0) {
        (pmVar3->currentFLACFrame).header.pcmFrameNumber = local_1c0;
        (pmVar3->currentFLACFrame).header.flacFrameNumber = (undefined4)local_1b8;
        (pmVar3->currentFLACFrame).header.sampleRate = local_1b8._4_4_;
        *(undefined8 *)&(pmVar3->currentFLACFrame).header.blockSizeInPCMFrames = local_1b0;
        do {
          mVar2 = ma_dr_flac__decode_flac_frame(in_stack_ffffffffffffed10);
          if (mVar2 == MA_SUCCESS) {
            return pmVar3;
          }
          if (mVar2 != MA_CRC_MISMATCH) {
            ma_dr_flac__free_from_callbacks
                      (in_stack_ffffffffffffed00,(ma_allocation_callbacks *)pInit);
            return (ma_dr_flac *)0x0;
          }
          mVar1 = ma_dr_flac__read_next_flac_frame_header
                            (in_stack_ffffffffffffee30,in_stack_ffffffffffffee2f,
                             in_stack_ffffffffffffee20);
        } while (mVar1 != 0);
        ma_dr_flac__free_from_callbacks(in_stack_ffffffffffffed00,(ma_allocation_callbacks *)pInit);
        local_48 = (ma_dr_flac *)0x0;
      }
    }
  }
  return local_48;
}

Assistant:

static ma_dr_flac* ma_dr_flac_open_with_metadata_private(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, ma_dr_flac_container container, void* pUserData, void* pUserDataMD, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac_init_info init;
    ma_uint32 allocationSize;
    ma_uint32 wholeSIMDVectorCountPerChannel;
    ma_uint32 decodedSamplesAllocationSize;
#ifndef MA_DR_FLAC_NO_OGG
    ma_dr_flac_oggbs* pOggbs = NULL;
#endif
    ma_uint64 firstFramePos;
    ma_uint64 seektablePos;
    ma_uint32 seekpointCount;
    ma_allocation_callbacks allocationCallbacks;
    ma_dr_flac* pFlac;
    ma_dr_flac__init_cpu_caps();
    if (!ma_dr_flac__init_private(&init, onRead, onSeek, onMeta, container, pUserData, pUserDataMD)) {
        return NULL;
    }
    if (pAllocationCallbacks != NULL) {
        allocationCallbacks = *pAllocationCallbacks;
        if (allocationCallbacks.onFree == NULL || (allocationCallbacks.onMalloc == NULL && allocationCallbacks.onRealloc == NULL)) {
            return NULL;
        }
    } else {
        allocationCallbacks.pUserData = NULL;
        allocationCallbacks.onMalloc  = ma_dr_flac__malloc_default;
        allocationCallbacks.onRealloc = ma_dr_flac__realloc_default;
        allocationCallbacks.onFree    = ma_dr_flac__free_default;
    }
    allocationSize = sizeof(ma_dr_flac);
    if ((init.maxBlockSizeInPCMFrames % (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) == 0) {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32)));
    } else {
        wholeSIMDVectorCountPerChannel = (init.maxBlockSizeInPCMFrames / (MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE / sizeof(ma_int32))) + 1;
    }
    decodedSamplesAllocationSize = wholeSIMDVectorCountPerChannel * MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE * init.channels;
    allocationSize += decodedSamplesAllocationSize;
    allocationSize += MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        allocationSize += sizeof(ma_dr_flac_oggbs);
        pOggbs = (ma_dr_flac_oggbs*)ma_dr_flac__malloc_from_callbacks(sizeof(*pOggbs), &allocationCallbacks);
        if (pOggbs == NULL) {
            return NULL;
        }
        MA_DR_FLAC_ZERO_MEMORY(pOggbs, sizeof(*pOggbs));
        pOggbs->onRead = onRead;
        pOggbs->onSeek = onSeek;
        pOggbs->pUserData = pUserData;
        pOggbs->currentBytePos = init.oggFirstBytePos;
        pOggbs->firstBytePos = init.oggFirstBytePos;
        pOggbs->serialNumber = init.oggSerial;
        pOggbs->bosPageHeader = init.oggBosHeader;
        pOggbs->bytesRemainingInPage = 0;
    }
#endif
    firstFramePos  = 42;
    seektablePos   = 0;
    seekpointCount = 0;
    if (init.hasMetadataBlocks) {
        ma_dr_flac_read_proc onReadOverride = onRead;
        ma_dr_flac_seek_proc onSeekOverride = onSeek;
        void* pUserDataOverride = pUserData;
#ifndef MA_DR_FLAC_NO_OGG
        if (init.container == ma_dr_flac_container_ogg) {
            onReadOverride = ma_dr_flac__on_read_ogg;
            onSeekOverride = ma_dr_flac__on_seek_ogg;
            pUserDataOverride = (void*)pOggbs;
        }
#endif
        if (!ma_dr_flac__read_and_decode_metadata(onReadOverride, onSeekOverride, onMeta, pUserDataOverride, pUserDataMD, &firstFramePos, &seektablePos, &seekpointCount, &allocationCallbacks)) {
        #ifndef MA_DR_FLAC_NO_OGG
            ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        #endif
            return NULL;
        }
        allocationSize += seekpointCount * sizeof(ma_dr_flac_seekpoint);
    }
    pFlac = (ma_dr_flac*)ma_dr_flac__malloc_from_callbacks(allocationSize, &allocationCallbacks);
    if (pFlac == NULL) {
    #ifndef MA_DR_FLAC_NO_OGG
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
    #endif
        return NULL;
    }
    ma_dr_flac__init_from_info(pFlac, &init);
    pFlac->allocationCallbacks = allocationCallbacks;
    pFlac->pDecodedSamples = (ma_int32*)ma_dr_flac_align((size_t)pFlac->pExtraData, MA_DR_FLAC_MAX_SIMD_VECTOR_SIZE);
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg) {
        ma_dr_flac_oggbs* pInternalOggbs = (ma_dr_flac_oggbs*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize + (seekpointCount * sizeof(ma_dr_flac_seekpoint)));
        MA_DR_FLAC_COPY_MEMORY(pInternalOggbs, pOggbs, sizeof(*pOggbs));
        ma_dr_flac__free_from_callbacks(pOggbs, &allocationCallbacks);
        pOggbs = NULL;
        pFlac->bs.onRead = ma_dr_flac__on_read_ogg;
        pFlac->bs.onSeek = ma_dr_flac__on_seek_ogg;
        pFlac->bs.pUserData = (void*)pInternalOggbs;
        pFlac->_oggbs = (void*)pInternalOggbs;
    }
#endif
    pFlac->firstFLACFramePosInBytes = firstFramePos;
#ifndef MA_DR_FLAC_NO_OGG
    if (init.container == ma_dr_flac_container_ogg)
    {
        pFlac->pSeekpoints = NULL;
        pFlac->seekpointCount = 0;
    }
    else
#endif
    {
        if (seektablePos != 0) {
            pFlac->seekpointCount = seekpointCount;
            pFlac->pSeekpoints = (ma_dr_flac_seekpoint*)((ma_uint8*)pFlac->pDecodedSamples + decodedSamplesAllocationSize);
            MA_DR_FLAC_ASSERT(pFlac->bs.onSeek != NULL);
            MA_DR_FLAC_ASSERT(pFlac->bs.onRead != NULL);
            if (pFlac->bs.onSeek(pFlac->bs.pUserData, (int)seektablePos, ma_dr_flac_seek_origin_start)) {
                ma_uint32 iSeekpoint;
                for (iSeekpoint = 0; iSeekpoint < seekpointCount; iSeekpoint += 1) {
                    if (pFlac->bs.onRead(pFlac->bs.pUserData, pFlac->pSeekpoints + iSeekpoint, MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) == MA_DR_FLAC_SEEKPOINT_SIZE_IN_BYTES) {
                        pFlac->pSeekpoints[iSeekpoint].firstPCMFrame   = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].firstPCMFrame);
                        pFlac->pSeekpoints[iSeekpoint].flacFrameOffset = ma_dr_flac__be2host_64(pFlac->pSeekpoints[iSeekpoint].flacFrameOffset);
                        pFlac->pSeekpoints[iSeekpoint].pcmFrameCount   = ma_dr_flac__be2host_16(pFlac->pSeekpoints[iSeekpoint].pcmFrameCount);
                    } else {
                        pFlac->pSeekpoints = NULL;
                        pFlac->seekpointCount = 0;
                        break;
                    }
                }
                if (!pFlac->bs.onSeek(pFlac->bs.pUserData, (int)pFlac->firstFLACFramePosInBytes, ma_dr_flac_seek_origin_start)) {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            } else {
                pFlac->pSeekpoints = NULL;
                pFlac->seekpointCount = 0;
            }
        }
    }
    if (!init.hasStreamInfoBlock) {
        pFlac->currentFLACFrame.header = init.firstFrameHeader;
        for (;;) {
            ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
            if (result == MA_SUCCESS) {
                break;
            } else {
                if (result == MA_CRC_MISMATCH) {
                    if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                        ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                        return NULL;
                    }
                    continue;
                } else {
                    ma_dr_flac__free_from_callbacks(pFlac, &allocationCallbacks);
                    return NULL;
                }
            }
        }
    }
    return pFlac;
}